

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stmt.h
# Opt level: O2

void __thiscall
enact::StructStmt::StructStmt
          (StructStmt *this,Token *name,
          vector<enact::StructStmt::Field,_std::allocator<enact::StructStmt::Field>_> *fields)

{
  pointer pFVar1;
  
  (this->super_Stmt)._vptr_Stmt = (_func_int **)&PTR__StructStmt_00124010;
  Token::Token(&this->name,name);
  pFVar1 = (fields->
           super__Vector_base<enact::StructStmt::Field,_std::allocator<enact::StructStmt::Field>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  (this->fields).
  super__Vector_base<enact::StructStmt::Field,_std::allocator<enact::StructStmt::Field>_>._M_impl.
  super__Vector_impl_data._M_start =
       (fields->
       super__Vector_base<enact::StructStmt::Field,_std::allocator<enact::StructStmt::Field>_>).
       _M_impl.super__Vector_impl_data._M_start;
  (this->fields).
  super__Vector_base<enact::StructStmt::Field,_std::allocator<enact::StructStmt::Field>_>._M_impl.
  super__Vector_impl_data._M_finish = pFVar1;
  (this->fields).
  super__Vector_base<enact::StructStmt::Field,_std::allocator<enact::StructStmt::Field>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (fields->
       super__Vector_base<enact::StructStmt::Field,_std::allocator<enact::StructStmt::Field>_>).
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (fields->super__Vector_base<enact::StructStmt::Field,_std::allocator<enact::StructStmt::Field>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (fields->super__Vector_base<enact::StructStmt::Field,_std::allocator<enact::StructStmt::Field>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (fields->super__Vector_base<enact::StructStmt::Field,_std::allocator<enact::StructStmt::Field>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

StructStmt(Token name, std::vector<Field>&& fields) :
                name{std::move(name)},
                fields{std::move(fields)} {}